

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_unit.cc
# Opt level: O1

void __thiscall pstack::Dwarf::Unit::load(Unit *this)

{
  Object *this_00;
  int iVar1;
  undefined4 extraout_var;
  undefined1 auVar2 [16];
  element_type *local_80;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_78;
  Object *local_70;
  uintmax_t code;
  undefined8 *local_60;
  undefined1 local_58 [8];
  DWARFReader abbR;
  
  this_00 = (this->dwarf->elf).super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  local_58 = (undefined1  [8])&abbR.end;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,".debug_abbrev","");
  Elf::Object::getDebugSection(this_00,(string *)local_58,0);
  if (local_58 != (undefined1  [8])&abbR.end) {
    operator_delete((void *)local_58,abbR.end + 1);
  }
  Elf::Section::io((Section *)&local_80);
  local_58 = (undefined1  [8])this->abbrevOffset;
  iVar1 = (*local_80->_vptr_Reader[8])();
  abbR.off = CONCAT44(extraout_var,iVar1);
  abbR.end = (Off)local_80;
  abbR.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)_Stack_78._M_pi;
  local_80 = (element_type *)0x0;
  _Stack_78._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  abbR.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _0_4_ = 8;
  while( true ) {
    auVar2 = (**(code **)(*(long *)abbR.end + 0x18))(abbR.end,local_58);
    local_70 = auVar2._0_8_;
    local_58 = (undefined1  [8])((long)local_58 + auVar2._8_8_);
    if (local_70 == (Object *)0x0) break;
    local_60 = (undefined8 *)local_58;
    code = (uintmax_t)&local_70;
    std::
    _Hashtable<unsigned_long,std::pair<unsigned_long_const,pstack::Dwarf::Abbreviation>,std::allocator<std::pair<unsigned_long_const,pstack::Dwarf::Abbreviation>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::
    _M_emplace<std::piecewise_construct_t_const&,std::tuple<unsigned_long&>,std::tuple<pstack::Dwarf::DWARFReader&>>
              ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,pstack::Dwarf::Abbreviation>,std::allocator<std::pair<unsigned_long_const,pstack::Dwarf::Abbreviation>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&this->abbreviations,&std::piecewise_construct,&code,&local_60);
  }
  if (abbR.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               abbR.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return;
}

Assistant:

void
Unit::load()
{
    auto &abbrev { dwarf->elf->getDebugSection(".debug_abbrev", SHT_NULL) };
    DWARFReader abbR(abbrev.io(), abbrevOffset);
    uintmax_t code;
    while ((code = abbR.getuleb128()) != 0)
        abbreviations.emplace(std::piecewise_construct,
                std::forward_as_tuple(code),
                std::forward_as_tuple(abbR));
}